

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O1

void __thiscall indk::NeuralNet::doInterlinkInit(NeuralNet *this,int port,int timeout)

{
  bool bVar1;
  Interlink *this_00;
  string local_88;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  this_00 = (Interlink *)operator_new(0xa0);
  Interlink::Interlink(this_00,port,timeout);
  this->InterlinkService = this_00;
  local_48._8_8_ = 0;
  pcStack_30 = std::
               _Function_handler<void_(indk::NeuralNet_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/src/neuralnet/neuralnet.cpp:48:83)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(indk::NeuralNet_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/src/neuralnet/neuralnet.cpp:48:83)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  Profiler::doAttachCallback(this,1,(ProfilerCallback *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  local_68._8_8_ = 0;
  pcStack_50 = std::
               _Function_handler<void_(indk::NeuralNet_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/src/neuralnet/neuralnet.cpp:58:88)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(indk::NeuralNet_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/src/neuralnet/neuralnet.cpp:58:88)>
             ::_M_manager;
  local_68._M_unused._M_object = this;
  Profiler::doAttachCallback(this,0,(ProfilerCallback *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  bVar1 = Interlink::isInterlinked(this->InterlinkService);
  if (bVar1) {
    Interlink::getStructure_abi_cxx11_(&local_88,this->InterlinkService);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_88._M_string_length != 0) {
      Interlink::getStructure_abi_cxx11_(&local_88,this->InterlinkService);
      setStructure(this,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void indk::NeuralNet::doInterlinkInit(int port, int timeout) {
    InterlinkService = new indk::Interlink(port, timeout);

    indk::Profiler::doAttachCallback(this, indk::Profiler::EventFlags::EventTick, [this](indk::NeuralNet *nn) {
        auto neurons = getNeurons();
        for (uint64_t i = 0; i < neurons.size(); i++) {
            if (i >= InterlinkDataBuffer.size()) {
                InterlinkDataBuffer.emplace_back();
            }
            InterlinkDataBuffer[i].push_back(std::to_string(neurons[i]->doSignalReceive().second));
        }
    });

    indk::Profiler::doAttachCallback(this, indk::Profiler::EventFlags::EventProcessed, [this](indk::NeuralNet *nn) {
        doInterlinkSyncData();
    });

    if (InterlinkService->isInterlinked()) {
        if (!InterlinkService->getStructure().empty()) setStructure(InterlinkService->getStructure());
    }
}